

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::TryMatchSetInst::Exec
          (TryMatchSetInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  uint64 *puVar1;
  CharCount CVar2;
  Label LVar3;
  bool bVar4;
  char *pcVar5;
  uint8 *puVar6;
  
  if (matcher->stats != (Type)0x0) {
    puVar1 = &matcher->stats->numCompares;
    *puVar1 = *puVar1 + 1;
  }
  if (*inputOffset < inputLength) {
    bVar4 = RuntimeCharSet<char16_t>::Get(&(this->super_SetMixin<false>).set,input[*inputOffset]);
    if (bVar4) {
      pcVar5 = ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
               Push<UnifiedRegex::ResumeCont>
                         (&contStack->
                           super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
      CVar2 = *inputOffset;
      LVar3 = (this->super_TryMixin).failLabel;
      pcVar5[8] = '\0';
      *(undefined ***)pcVar5 = &PTR_Print_013e01e8;
      *(CharCount *)(pcVar5 + 0xc) = CVar2;
      *(Label *)(pcVar5 + 0x10) = LVar3;
      Matcher::PushStats(matcher,contStack,input);
      *inputOffset = *inputOffset + 1;
      puVar6 = *instPointer + 0x2d;
      goto LAB_00d4f23a;
    }
  }
  puVar6 = Matcher::LabelToInstPointer(matcher,(this->super_TryMixin).failLabel);
LAB_00d4f23a:
  *instPointer = puVar6;
  return false;
}

Assistant:

inline bool TryMatchSetInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        if (inputOffset < inputLength && set.Get(input[inputOffset]))
        {
            // CHOICEPOINT: Resume at fail label on backtrack
            PUSH(contStack, ResumeCont, inputOffset, failLabel);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
            inputOffset++;
            instPointer += sizeof(*this);
            return false;
        }

        // Proceed directly to exit
        instPointer = matcher.LabelToInstPointer(failLabel);
        return false;
    }